

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float64_div_mips64el(float64 a,float64 b,float_status *s)

{
  int iVar1;
  int iVar2;
  float64 fVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  
  bVar4 = s->float_exception_flags;
  if (((bVar4 & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      bVar5 = (a & 0x7ff0000000000000) == 0;
      bVar6 = (a & 0x7fffffffffffffff) != 0;
      if (bVar6 && bVar5) {
        a = a & 0x8000000000000000;
        bVar4 = bVar4 | 0x40;
      }
      bVar7 = (b & 0x7ff0000000000000) == 0;
      bVar8 = (b & 0x7fffffffffffffff) != 0;
      if (bVar8 && bVar7) {
        b = b & 0x8000000000000000;
        bVar4 = bVar4 | 0x40;
      }
      if (bVar6 && bVar5 || bVar8 && bVar7) {
        s->float_exception_flags = bVar4;
      }
    }
    iVar1 = __fpclassify((double)a);
    if ((iVar1 == 4) || (iVar1 == 2)) {
      iVar2 = __fpclassify((double)b);
      if (iVar2 == 4) {
        dVar9 = (double)a / (double)b;
        if (ABS(dVar9) == INFINITY) {
          s->float_exception_flags = bVar4 | 8;
        }
        else if ((ABS(dVar9) <= 2.2250738585072014e-308) && (iVar1 != 2)) goto LAB_00917973;
        return (float64)dVar9;
      }
    }
  }
LAB_00917973:
  fVar3 = soft_f64_div(a,b,s);
  return fVar3;
}

Assistant:

float64 QEMU_FLATTEN
float64_div(float64 a, float64 b, float_status *s)
{
    return float64_gen2(a, b, s, hard_f64_div, soft_f64_div,
                        f64_div_pre, f64_div_post, NULL, NULL);
}